

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
(anonymous_namespace)::FileSetType::WriteProperties<std::__cxx11::string>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool clear)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  string_view sVar6;
  string_view description;
  string_view description_00;
  int iVar7;
  size_type __rlen;
  _Alloc_hider _Var8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  size_type local_f0;
  pointer local_e8;
  undefined8 local_e0;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_48;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  pcVar1 = (prop->_M_dataplus)._M_p;
  pcVar2 = (pointer)prop->_M_string_length;
  if ((pcVar2 == *(pointer *)(this + 0x10)) &&
     ((pcVar2 == (pointer)0x0 ||
      (iVar7 = bcmp(pcVar1,*(void **)(this + 0x18),(size_t)pcVar2), iVar7 == 0)))) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,*(long *)(this + 8),*(long *)this + *(long *)(this + 8));
    pcVar1 = (value->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + value->_M_string_length);
    cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
              (impl,tgt,(string *)local_110,&local_70,*(string_view *)this,
               *(string_view *)(this + 0x60),false);
    _Var8._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0020383d:
      operator_delete(_Var8._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((pcVar2 != *(pointer *)(this + 0x20)) ||
       ((pcVar2 != (pointer)0x0 &&
        (iVar7 = bcmp(pcVar1,*(void **)(this + 0x28),(size_t)pcVar2), iVar7 != 0)))) {
      local_110._0_8_ = pcVar2;
      local_110._8_8_ = pcVar1;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_110,0,
                         ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x30))->_M_len
                         ,*(basic_string_view<char,_std::char_traits<char>_> *)(this + 0x30));
      if (iVar7 == 0) {
        std::__cxx11::string::substr((ulong)&local_130,(ulong)prop);
        if (local_130._M_string_length == 0) {
          pcVar5 = impl->Makefile;
          local_110._0_8_ = *(undefined8 *)(this + 0x70);
          local_110._8_8_ = *(undefined8 *)(this + 0x78);
          local_110._16_8_ = 0x16;
          local_110._24_8_ = " name cannot be empty.";
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_110;
          cmCatViews_abi_cxx11_(&local_150,views_01);
          cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_150);
LAB_00203b9c:
          local_b0.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_00203baf:
            operator_delete(local_150._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pcVar1 = (value->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + value->_M_string_length);
          sVar6 = *(string_view *)this;
          local_110._0_8_ = *(undefined8 *)(this + 0x70);
          local_110._8_8_ = *(undefined8 *)(this + 0x78);
          local_110._16_8_ = 2;
          local_110._24_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
          local_f0 = local_130._M_string_length;
          local_e8 = local_130._M_dataplus._M_p;
          local_e0 = 1;
          local_d8 = "\"";
          views._M_len = 4;
          views._M_array = (iterator)local_110;
          cmCatViews_abi_cxx11_(&local_150,views);
          local_40 = local_150._M_string_length;
          paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_150._M_dataplus._M_p;
          description._M_str = local_150._M_dataplus._M_p;
          description._M_len = local_150._M_string_length;
          cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
                    (impl,tgt,&local_130,&local_b0,sVar6,description,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          local_150._M_dataplus._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_00203baf;
        }
      }
      else {
        local_110._8_8_ = (prop->_M_dataplus)._M_p;
        local_110._0_8_ = prop->_M_string_length;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_110,0,
                           ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x40))->
                           _M_len,*(basic_string_view<char,_std::char_traits<char>_> *)(this + 0x40)
                          );
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)prop);
          if (local_130._M_string_length == 0) {
            pcVar5 = impl->Makefile;
            local_110._0_8_ = *(undefined8 *)(this + 0x70);
            local_110._8_8_ = *(undefined8 *)(this + 0x78);
            local_110._16_8_ = 0x16;
            local_110._24_8_ = " name cannot be empty.";
            views_03._M_len = 2;
            views_03._M_array = (iterator)local_110;
            cmCatViews_abi_cxx11_(&local_150,views_03);
            cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_150);
            goto LAB_00203b9c;
          }
          pcVar1 = (value->_M_dataplus)._M_p;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,pcVar1 + value->_M_string_length);
          sVar6 = *(string_view *)this;
          local_110._0_8_ = *(undefined8 *)(this + 0x70);
          local_110._8_8_ = *(undefined8 *)(this + 0x78);
          local_110._16_8_ = 2;
          local_110._24_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
          local_f0 = local_130._M_string_length;
          local_e8 = local_130._M_dataplus._M_p;
          local_e0 = 1;
          local_d8 = "\"";
          views_00._M_len = 4;
          views_00._M_array = (iterator)local_110;
          cmCatViews_abi_cxx11_(&local_150,views_00);
          local_50 = local_150._M_string_length;
          paStack_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_150._M_dataplus._M_p;
          description_00._M_str = local_150._M_dataplus._M_p;
          description_00._M_len = local_150._M_string_length;
          cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                    (impl,tgt,&local_130,&local_d0,sVar6,description_00,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          local_b0.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
          local_150._M_dataplus._M_p = local_d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_00203baf;
        }
        else {
          pcVar1 = (prop->_M_dataplus)._M_p;
          pcVar2 = (pointer)prop->_M_string_length;
          pcVar3 = *(pointer *)(this + 0x80);
          if ((pcVar2 == pcVar3) &&
             ((pcVar4 = *(char **)(this + 0x88), pcVar2 == (pointer)0x0 ||
              (iVar7 = bcmp(pcVar1,pcVar4,(size_t)pcVar2), iVar7 == 0)))) {
            pcVar5 = impl->Makefile;
            local_110._16_8_ = 0x17;
            local_110._24_8_ = (long)"NAME property is read-only\n" + 4;
            views_02._M_len = 2;
            views_02._M_array = (iterator)local_110;
            local_110._0_8_ = pcVar3;
            local_110._8_8_ = pcVar4;
            cmCatViews_abi_cxx11_(&local_130,views_02);
            cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_130);
          }
          else {
            pcVar3 = *(pointer *)(this + 0xa8);
            if ((pcVar2 != pcVar3) ||
               ((pcVar4 = *(char **)(this + 0xb0), pcVar2 != (pointer)0x0 &&
                (iVar7 = bcmp(pcVar1,pcVar4,(size_t)pcVar2), iVar7 != 0)))) {
              return false;
            }
            pcVar5 = impl->Makefile;
            local_110._16_8_ = 0x17;
            local_110._24_8_ = (long)"NAME property is read-only\n" + 4;
            views_04._M_len = 2;
            views_04._M_array = (iterator)local_110;
            local_110._0_8_ = pcVar3;
            local_110._8_8_ = pcVar4;
            cmCatViews_abi_cxx11_(&local_130,views_04);
            cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_130);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == &local_130.field_2) {
        return true;
      }
      goto LAB_00203bca;
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,*(long *)(this + 8),*(long *)this + *(long *)(this + 8));
    pcVar1 = (value->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + value->_M_string_length);
    cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
              (impl,tgt,(string *)local_110,&local_90,*(string_view *)this,
               *(string_view *)(this + 0x60),false);
    local_70.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    _Var8._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0020383d;
  }
  local_130.field_2._M_allocated_capacity = local_110._16_8_;
  local_130._M_dataplus._M_p = (pointer)local_110._0_8_;
  if ((undefined1 *)local_110._0_8_ == local_110 + 0x10) {
    return true;
  }
LAB_00203bca:
  operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  return true;
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}